

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpool.h
# Opt level: O2

void __thiscall CVmPoolPaged::~CVmPoolPaged(CVmPoolPaged *this)

{
  ~CVmPoolPaged(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

virtual ~CVmPoolPaged() { terminate_nv(); }